

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_recover
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,
              secp256k1_ecdsa_recoverable_signature *signature,uchar *msg32)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined4 extraout_EAX;
  int iVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  undefined1 auVar87 [16];
  secp256k1_scalar r;
  secp256k1_scalar s;
  secp256k1_ge x;
  secp256k1_scalar u1;
  secp256k1_scalar rn;
  secp256k1_ge q;
  uchar brx [32];
  secp256k1_scalar m;
  secp256k1_scalar u2;
  secp256k1_gej xj;
  secp256k1_gej qj;
  secp256k1_fe local_308;
  secp256k1_scalar local_2d8;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  secp256k1_ge local_290;
  secp256k1_scalar local_238;
  secp256k1_scalar local_218;
  undefined1 local_1f8 [96];
  uchar local_198 [32];
  secp256k1_scalar local_178;
  secp256k1_scalar local_158;
  undefined1 local_138 [104];
  undefined1 local_d0 [16];
  int local_c0;
  secp256k1_gej local_b0;
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_ecdsa_recover_cold_4();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_ecdsa_recover_cold_3();
  }
  else if (signature == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    secp256k1_ecdsa_recover_cold_2();
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ecdsa_recover_cold_1();
  }
  else {
    local_2d8.d[0] = *(uint64_t *)signature->data;
    local_2d8.d[1] = *(uint64_t *)(signature->data + 8);
    local_2d8.d[2] = *(uint64_t *)(signature->data + 0x10);
    local_2d8.d[3] = *(uint64_t *)(signature->data + 0x18);
    local_2b8 = *(ulong *)(signature->data + 0x20);
    uStack_2b0 = *(ulong *)(signature->data + 0x28);
    local_2a8 = *(ulong *)(signature->data + 0x30);
    uStack_2a0 = *(ulong *)(signature->data + 0x38);
    bVar1 = signature->data[0x40];
    secp256k1_scalar_set_b32(&local_178,msg32,(int *)0x0);
    auVar87._0_4_ = -(uint)((int)local_2d8.d[0] == 0 && (int)local_2d8.d[2] == 0);
    auVar87._4_4_ = -(uint)(local_2d8.d[0]._4_4_ == 0 && local_2d8.d[2]._4_4_ == 0);
    auVar87._8_4_ = -(uint)((int)local_2d8.d[1] == 0 && (int)local_2d8.d[3] == 0);
    auVar87._12_4_ = -(uint)(local_2d8.d[1]._4_4_ == 0 && local_2d8.d[3]._4_4_ == 0);
    iVar69 = movmskps(extraout_EAX,auVar87);
    if ((iVar69 != 0xf) &&
       ((uStack_2b0 != 0 || uStack_2a0 != 0) || (local_2b8 != 0 || local_2a8 != 0))) {
      secp256k1_scalar_get_b32(local_198,&local_2d8);
      secp256k1_fe_set_b32(&local_308,local_198);
      if ((bVar1 & 2) == 0) {
LAB_0018f172:
        iVar69 = secp256k1_ge_set_xo_var(&local_290,&local_308,bVar1 & 1);
        if (iVar69 != 0) {
          local_c0 = local_290.infinity;
          local_138._0_8_ = local_290.x.n[0];
          local_138._8_8_ = local_290.x.n[1];
          local_138._16_8_ = local_290.x.n[2];
          local_138._24_8_ = local_290.x.n[3];
          local_138._32_8_ = local_290.x.n[4];
          local_138._40_8_ = local_290.y.n[0];
          local_138._48_8_ = local_290.y.n[1];
          local_138._56_8_ = local_290.y.n[2];
          local_138._64_8_ = local_290.y.n[3];
          local_138._72_8_ = local_290.y.n[4];
          local_138._80_8_ = 1;
          local_138._88_16_ = (undefined1  [16])0x0;
          local_d0 = (undefined1  [16])0x0;
          secp256k1_scalar_inverse(&local_218,&local_2d8);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_218.d[0];
          auVar34._8_8_ = 0;
          auVar34._0_8_ = local_178.d[0];
          uVar71 = SUB168(auVar2 * auVar34,8);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar71;
          local_1f8._0_8_ = SUB168(auVar2 * auVar34,0);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_218.d[0];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = local_178.d[1];
          auVar3 = auVar3 * auVar35;
          uVar76 = SUB168(auVar3 + auVar67,0);
          uVar81 = SUB168(auVar3 + auVar67,8);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_218.d[1];
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_178.d[0];
          uVar72 = SUB168(auVar4 * auVar36,8);
          uVar70 = SUB168(auVar4 * auVar36,0);
          local_1f8._8_8_ = uVar76 + uVar70;
          uVar70 = (ulong)CARRY8(uVar76,uVar70);
          uVar76 = uVar81 + uVar72;
          uVar82 = uVar76 + uVar70;
          uVar83 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar71,auVar3._0_8_)) +
                   (ulong)(CARRY8(uVar81,uVar72) || CARRY8(uVar76,uVar70));
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_218.d[0];
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_178.d[2];
          uVar73 = SUB168(auVar5 * auVar37,8);
          uVar70 = SUB168(auVar5 * auVar37,0);
          uVar71 = uVar82 + uVar70;
          uVar70 = (ulong)CARRY8(uVar82,uVar70);
          uVar72 = uVar83 + uVar73;
          uVar84 = uVar72 + uVar70;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_218.d[1];
          auVar38._8_8_ = 0;
          auVar38._0_8_ = local_178.d[1];
          uVar74 = SUB168(auVar6 * auVar38,8);
          uVar76 = SUB168(auVar6 * auVar38,0);
          uVar82 = uVar71 + uVar76;
          uVar76 = (ulong)CARRY8(uVar71,uVar76);
          uVar81 = uVar84 + uVar74;
          uVar85 = uVar81 + uVar76;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_218.d[2];
          auVar39._8_8_ = 0;
          auVar39._0_8_ = local_178.d[0];
          uVar75 = SUB168(auVar7 * auVar39,8);
          uVar71 = SUB168(auVar7 * auVar39,0);
          local_1f8._16_8_ = uVar82 + uVar71;
          uVar71 = (ulong)CARRY8(uVar82,uVar71);
          uVar82 = uVar85 + uVar75;
          uVar86 = uVar82 + uVar71;
          uVar77 = (ulong)(CARRY8(uVar83,uVar73) || CARRY8(uVar72,uVar70)) +
                   (ulong)(CARRY8(uVar84,uVar74) || CARRY8(uVar81,uVar76)) +
                   (ulong)(CARRY8(uVar85,uVar75) || CARRY8(uVar82,uVar71));
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_218.d[0];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = local_178.d[3];
          uVar75 = SUB168(auVar8 * auVar40,8);
          uVar70 = SUB168(auVar8 * auVar40,0);
          uVar71 = uVar86 + uVar70;
          uVar70 = (ulong)CARRY8(uVar86,uVar70);
          uVar81 = uVar77 + uVar75;
          uVar86 = uVar81 + uVar70;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_218.d[1];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = local_178.d[2];
          uVar83 = SUB168(auVar9 * auVar41,8);
          uVar76 = SUB168(auVar9 * auVar41,0);
          uVar72 = uVar71 + uVar76;
          uVar76 = (ulong)CARRY8(uVar71,uVar76);
          uVar82 = uVar86 + uVar83;
          uVar78 = uVar82 + uVar76;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_218.d[2];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = local_178.d[1];
          uVar84 = SUB168(auVar10 * auVar42,8);
          uVar71 = SUB168(auVar10 * auVar42,0);
          uVar74 = uVar72 + uVar71;
          uVar71 = (ulong)CARRY8(uVar72,uVar71);
          uVar73 = uVar78 + uVar84;
          uVar79 = uVar73 + uVar71;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_218.d[3];
          auVar43._8_8_ = 0;
          auVar43._0_8_ = local_178.d[0];
          uVar85 = SUB168(auVar11 * auVar43,8);
          uVar72 = SUB168(auVar11 * auVar43,0);
          local_1f8._24_8_ = uVar74 + uVar72;
          uVar72 = (ulong)CARRY8(uVar74,uVar72);
          uVar74 = uVar79 + uVar85;
          uVar80 = uVar74 + uVar72;
          uVar83 = (ulong)(CARRY8(uVar77,uVar75) || CARRY8(uVar81,uVar70)) +
                   (ulong)(CARRY8(uVar86,uVar83) || CARRY8(uVar82,uVar76)) +
                   (ulong)(CARRY8(uVar78,uVar84) || CARRY8(uVar73,uVar71)) +
                   (ulong)(CARRY8(uVar79,uVar85) || CARRY8(uVar74,uVar72));
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_218.d[1];
          auVar44._8_8_ = 0;
          auVar44._0_8_ = local_178.d[3];
          uVar73 = SUB168(auVar12 * auVar44,8);
          uVar70 = SUB168(auVar12 * auVar44,0);
          uVar71 = uVar80 + uVar70;
          uVar70 = (ulong)CARRY8(uVar80,uVar70);
          uVar72 = uVar83 + uVar73;
          uVar84 = uVar72 + uVar70;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_218.d[2];
          auVar45._8_8_ = 0;
          auVar45._0_8_ = local_178.d[2];
          uVar74 = SUB168(auVar13 * auVar45,8);
          uVar76 = SUB168(auVar13 * auVar45,0);
          uVar82 = uVar71 + uVar76;
          uVar76 = (ulong)CARRY8(uVar71,uVar76);
          uVar81 = uVar84 + uVar74;
          uVar85 = uVar81 + uVar76;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_218.d[3];
          auVar46._8_8_ = 0;
          auVar46._0_8_ = local_178.d[1];
          uVar75 = SUB168(auVar14 * auVar46,8);
          uVar71 = SUB168(auVar14 * auVar46,0);
          local_1f8._32_8_ = uVar82 + uVar71;
          uVar71 = (ulong)CARRY8(uVar82,uVar71);
          uVar82 = uVar85 + uVar75;
          uVar77 = uVar82 + uVar71;
          uVar73 = (ulong)(CARRY8(uVar83,uVar73) || CARRY8(uVar72,uVar70)) +
                   (ulong)(CARRY8(uVar84,uVar74) || CARRY8(uVar81,uVar76)) +
                   (ulong)(CARRY8(uVar85,uVar75) || CARRY8(uVar82,uVar71));
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_218.d[2];
          auVar47._8_8_ = 0;
          auVar47._0_8_ = local_178.d[3];
          uVar81 = SUB168(auVar15 * auVar47,8);
          uVar70 = SUB168(auVar15 * auVar47,0);
          uVar72 = uVar77 + uVar70;
          uVar70 = (ulong)CARRY8(uVar77,uVar70);
          uVar71 = uVar73 + uVar81;
          uVar74 = uVar71 + uVar70;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_218.d[3];
          auVar48._8_8_ = 0;
          auVar48._0_8_ = local_178.d[2];
          uVar82 = SUB168(auVar16 * auVar48,8);
          uVar76 = SUB168(auVar16 * auVar48,0);
          local_1f8._40_8_ = uVar72 + uVar76;
          uVar76 = (ulong)CARRY8(uVar72,uVar76);
          uVar72 = uVar74 + uVar82;
          local_1f8._56_8_ =
               (ulong)(CARRY8(uVar73,uVar81) || CARRY8(uVar71,uVar70)) +
               (ulong)(CARRY8(uVar74,uVar82) || CARRY8(uVar72,uVar76));
          local_1f8._48_8_ = uVar72 + uVar76;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_218.d[3];
          auVar49._8_8_ = 0;
          auVar49._0_8_ = local_178.d[3];
          local_1f8._48_16_ = auVar17 * auVar49 + local_1f8._48_16_;
          secp256k1_scalar_reduce_512(&local_238,(uint64_t *)local_1f8);
          secp256k1_scalar_negate(&local_238,&local_238);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_218.d[0];
          auVar50._8_8_ = 0;
          auVar50._0_8_ = local_2b8;
          uVar71 = SUB168(auVar18 * auVar50,8);
          auVar68._8_8_ = 0;
          auVar68._0_8_ = uVar71;
          local_1f8._0_8_ = SUB168(auVar18 * auVar50,0);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_218.d[0];
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uStack_2b0;
          auVar19 = auVar19 * auVar51;
          uVar76 = SUB168(auVar19 + auVar68,0);
          uVar81 = SUB168(auVar19 + auVar68,8);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_218.d[1];
          auVar52._8_8_ = 0;
          auVar52._0_8_ = local_2b8;
          uVar72 = SUB168(auVar20 * auVar52,8);
          uVar70 = SUB168(auVar20 * auVar52,0);
          local_1f8._8_8_ = uVar76 + uVar70;
          uVar70 = (ulong)CARRY8(uVar76,uVar70);
          uVar76 = uVar81 + uVar72;
          uVar82 = uVar76 + uVar70;
          uVar83 = (ulong)CARRY8(auVar19._8_8_,(ulong)CARRY8(uVar71,auVar19._0_8_)) +
                   (ulong)(CARRY8(uVar81,uVar72) || CARRY8(uVar76,uVar70));
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_218.d[0];
          auVar53._8_8_ = 0;
          auVar53._0_8_ = local_2a8;
          uVar73 = SUB168(auVar21 * auVar53,8);
          uVar70 = SUB168(auVar21 * auVar53,0);
          uVar71 = uVar82 + uVar70;
          uVar70 = (ulong)CARRY8(uVar82,uVar70);
          uVar72 = uVar83 + uVar73;
          uVar84 = uVar72 + uVar70;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = local_218.d[1];
          auVar54._8_8_ = 0;
          auVar54._0_8_ = uStack_2b0;
          uVar74 = SUB168(auVar22 * auVar54,8);
          uVar76 = SUB168(auVar22 * auVar54,0);
          uVar82 = uVar71 + uVar76;
          uVar76 = (ulong)CARRY8(uVar71,uVar76);
          uVar81 = uVar84 + uVar74;
          uVar85 = uVar81 + uVar76;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = local_218.d[2];
          auVar55._8_8_ = 0;
          auVar55._0_8_ = local_2b8;
          uVar75 = SUB168(auVar23 * auVar55,8);
          uVar71 = SUB168(auVar23 * auVar55,0);
          local_1f8._16_8_ = uVar82 + uVar71;
          uVar71 = (ulong)CARRY8(uVar82,uVar71);
          uVar82 = uVar85 + uVar75;
          uVar86 = uVar82 + uVar71;
          uVar77 = (ulong)(CARRY8(uVar83,uVar73) || CARRY8(uVar72,uVar70)) +
                   (ulong)(CARRY8(uVar84,uVar74) || CARRY8(uVar81,uVar76)) +
                   (ulong)(CARRY8(uVar85,uVar75) || CARRY8(uVar82,uVar71));
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_218.d[0];
          auVar56._8_8_ = 0;
          auVar56._0_8_ = uStack_2a0;
          uVar75 = SUB168(auVar24 * auVar56,8);
          uVar70 = SUB168(auVar24 * auVar56,0);
          uVar71 = uVar86 + uVar70;
          uVar70 = (ulong)CARRY8(uVar86,uVar70);
          uVar81 = uVar77 + uVar75;
          uVar86 = uVar81 + uVar70;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_218.d[1];
          auVar57._8_8_ = 0;
          auVar57._0_8_ = local_2a8;
          uVar83 = SUB168(auVar25 * auVar57,8);
          uVar76 = SUB168(auVar25 * auVar57,0);
          uVar72 = uVar71 + uVar76;
          uVar76 = (ulong)CARRY8(uVar71,uVar76);
          uVar82 = uVar86 + uVar83;
          uVar78 = uVar82 + uVar76;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = local_218.d[2];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uStack_2b0;
          uVar84 = SUB168(auVar26 * auVar58,8);
          uVar71 = SUB168(auVar26 * auVar58,0);
          uVar74 = uVar72 + uVar71;
          uVar71 = (ulong)CARRY8(uVar72,uVar71);
          uVar73 = uVar78 + uVar84;
          uVar79 = uVar73 + uVar71;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = local_218.d[3];
          auVar59._8_8_ = 0;
          auVar59._0_8_ = local_2b8;
          uVar85 = SUB168(auVar27 * auVar59,8);
          uVar72 = SUB168(auVar27 * auVar59,0);
          local_1f8._24_8_ = uVar74 + uVar72;
          uVar72 = (ulong)CARRY8(uVar74,uVar72);
          uVar74 = uVar79 + uVar85;
          uVar80 = uVar74 + uVar72;
          uVar83 = (ulong)(CARRY8(uVar77,uVar75) || CARRY8(uVar81,uVar70)) +
                   (ulong)(CARRY8(uVar86,uVar83) || CARRY8(uVar82,uVar76)) +
                   (ulong)(CARRY8(uVar78,uVar84) || CARRY8(uVar73,uVar71)) +
                   (ulong)(CARRY8(uVar79,uVar85) || CARRY8(uVar74,uVar72));
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_218.d[1];
          auVar60._8_8_ = 0;
          auVar60._0_8_ = uStack_2a0;
          uVar73 = SUB168(auVar28 * auVar60,8);
          uVar70 = SUB168(auVar28 * auVar60,0);
          uVar71 = uVar80 + uVar70;
          uVar70 = (ulong)CARRY8(uVar80,uVar70);
          uVar72 = uVar83 + uVar73;
          uVar84 = uVar72 + uVar70;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_218.d[2];
          auVar61._8_8_ = 0;
          auVar61._0_8_ = local_2a8;
          uVar74 = SUB168(auVar29 * auVar61,8);
          uVar76 = SUB168(auVar29 * auVar61,0);
          uVar82 = uVar71 + uVar76;
          uVar76 = (ulong)CARRY8(uVar71,uVar76);
          uVar81 = uVar84 + uVar74;
          uVar85 = uVar81 + uVar76;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_218.d[3];
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uStack_2b0;
          uVar75 = SUB168(auVar30 * auVar62,8);
          uVar71 = SUB168(auVar30 * auVar62,0);
          local_1f8._32_8_ = uVar82 + uVar71;
          uVar71 = (ulong)CARRY8(uVar82,uVar71);
          uVar82 = uVar85 + uVar75;
          uVar77 = uVar82 + uVar71;
          uVar73 = (ulong)(CARRY8(uVar83,uVar73) || CARRY8(uVar72,uVar70)) +
                   (ulong)(CARRY8(uVar84,uVar74) || CARRY8(uVar81,uVar76)) +
                   (ulong)(CARRY8(uVar85,uVar75) || CARRY8(uVar82,uVar71));
          auVar31._8_8_ = 0;
          auVar31._0_8_ = local_218.d[2];
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uStack_2a0;
          uVar81 = SUB168(auVar31 * auVar63,8);
          uVar70 = SUB168(auVar31 * auVar63,0);
          uVar72 = uVar77 + uVar70;
          uVar70 = (ulong)CARRY8(uVar77,uVar70);
          uVar71 = uVar73 + uVar81;
          uVar74 = uVar71 + uVar70;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_218.d[3];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = local_2a8;
          uVar82 = SUB168(auVar32 * auVar64,8);
          uVar76 = SUB168(auVar32 * auVar64,0);
          local_1f8._40_8_ = uVar72 + uVar76;
          uVar76 = (ulong)CARRY8(uVar72,uVar76);
          uVar72 = uVar74 + uVar82;
          auVar66._8_8_ =
               (ulong)(CARRY8(uVar73,uVar81) || CARRY8(uVar71,uVar70)) +
               (ulong)(CARRY8(uVar74,uVar82) || CARRY8(uVar72,uVar76));
          auVar66._0_8_ = uVar72 + uVar76;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = local_218.d[3];
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uStack_2a0;
          local_1f8._48_16_ = auVar33 * auVar65 + auVar66;
          secp256k1_scalar_reduce_512(&local_158,(uint64_t *)local_1f8);
          secp256k1_ecmult(&ctx->ecmult_ctx,&local_b0,(secp256k1_gej *)local_138,&local_158,
                           &local_238);
          secp256k1_ge_set_gej_var((secp256k1_ge *)local_1f8,&local_b0);
          if (local_b0.infinity == 0) {
            secp256k1_ge_to_storage((secp256k1_ge_storage *)local_138,(secp256k1_ge *)local_1f8);
            *(undefined8 *)(pubkey->data + 0x30) = local_138._48_8_;
            *(undefined8 *)(pubkey->data + 0x38) = local_138._56_8_;
            *(undefined8 *)(pubkey->data + 0x20) = local_138._32_8_;
            *(undefined8 *)(pubkey->data + 0x28) = local_138._40_8_;
            *(undefined8 *)(pubkey->data + 0x10) = local_138._16_8_;
            *(undefined8 *)(pubkey->data + 0x18) = local_138._24_8_;
            *(undefined8 *)pubkey->data = local_138._0_8_;
            *(undefined8 *)(pubkey->data + 8) = local_138._8_8_;
            return 1;
          }
        }
      }
      else {
        uVar70 = 4;
        do {
          iVar69 = (int)uVar70;
          uVar76 = secp256k1_ecdsa_const_p_minus_order.n[uVar70];
          uVar70 = local_308.n[uVar70];
          if (uVar70 >= uVar76 && uVar70 != uVar76) break;
          if (uVar70 < uVar76) {
            local_308.n[0] = local_308.n[0] + 0x25e8cd0364141;
            local_308.n[1] = local_308.n[1] + 0xe6af48a03bbfd;
            local_308.n[2] = local_308.n[2] + 0xffffffebaaedc;
            local_308.n[3] = local_308.n[3] + 0xfffffffffffff;
            local_308.n[4] = local_308.n[4] + 0xffffffffffff;
            goto LAB_0018f172;
          }
          uVar70 = (ulong)(iVar69 - 1);
        } while (iVar69 != 0);
      }
    }
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_recover(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const secp256k1_ecdsa_recoverable_signature *signature, const unsigned char *msg32) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    int recid;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, signature);
    VERIFY_CHECK(recid >= 0 && recid < 4);  /* should have been caught in parse_compact */
    secp256k1_scalar_set_b32(&m, msg32, NULL);
    if (secp256k1_ecdsa_sig_recover(&ctx->ecmult_ctx, &r, &s, &q, &m, recid)) {
        secp256k1_pubkey_save(pubkey, &q);
        return 1;
    } else {
        memset(pubkey, 0, sizeof(*pubkey));
        return 0;
    }
}